

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O2

void __thiscall Type::Type(Type *this,TypeType tot)

{
  FieldList *pFVar1;
  AttrList *pAVar2;
  ExprList *pEVar3;
  
  Object::Object(&this->super_Object);
  DataDepElement::DataDepElement(&this->super_DataDepElement,TYPE);
  (this->super_DataDepElement)._vptr_DataDepElement = (_func_int **)&PTR__Type_00141b00;
  this->tot_ = tot;
  (this->data_id_str_)._M_dataplus._M_p = (pointer)&(this->data_id_str_).field_2;
  (this->data_id_str_)._M_string_length = 0;
  (this->data_id_str_).field_2._M_local_buf[0] = '\0';
  (this->lvalue_)._M_dataplus._M_p = (pointer)&(this->lvalue_).field_2;
  (this->lvalue_)._M_string_length = 0;
  (this->lvalue_).field_2._M_local_buf[0] = '\0';
  this->type_decl_ = (TypeDecl *)0x0;
  this->type_decl_id_ = current_decl_id;
  this->declared_as_type_ = false;
  this->env_ = (Env *)0x0;
  this->value_var_ = default_value_var;
  this->value_var_type_ = 3;
  this->anonymous_value_var_ = false;
  this->incremental_input_ = false;
  this->incremental_parsing_ = false;
  this->buffer_input_ = false;
  this->size_var_field_ = (Field *)0x0;
  this->size_expr_ = (char *)0x0;
  this->boundary_checked_ = false;
  this->parsing_complete_var_field_ = (Field *)0x0;
  this->parsing_state_var_field_ = (Field *)0x0;
  this->buffering_state_var_field_ = (Field *)0x0;
  this->array_until_input_ = (ArrayType *)0x0;
  this->has_value_field_ = (LetField *)0x0;
  pFVar1 = (FieldList *)operator_new(0x18);
  (pFVar1->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pFVar1->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pFVar1->super__Vector_base<Field_*,_std::allocator<Field_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->fields_ = pFVar1;
  pAVar2 = (AttrList *)operator_new(0x18);
  (pAVar2->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pAVar2->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pAVar2->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->attrs_ = pAVar2;
  this->attr_byteorder_expr_ = (Expr *)0x0;
  pEVar3 = (ExprList *)operator_new(0x18);
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->attr_checks_ = pEVar3;
  pEVar3 = (ExprList *)operator_new(0x18);
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->attr_enforces_ = pEVar3;
  this->attr_chunked_ = false;
  this->attr_exportsourcedata_ = false;
  this->attr_if_expr_ = (Expr *)0x0;
  this->attr_length_expr_ = (Expr *)0x0;
  this->attr_letfields_ = (FieldList *)0x0;
  this->attr_multiline_end_ = (Expr *)0x0;
  *(undefined8 *)((long)&this->attr_multiline_end_ + 2) = 0;
  *(undefined8 *)((long)&this->attr_linebreaker_ + 2) = 0;
  pEVar3 = (ExprList *)operator_new(0x18);
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pEVar3->super__Vector_base<Expr_*,_std::allocator<Expr_*>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->attr_requires_ = pEVar3;
  this->attr_restofdata_ = false;
  this->attr_restofflow_ = false;
  this->attr_transient_ = false;
  return;
}

Assistant:

Type::Type(TypeType tot) : DataDepElement(DataDepElement::TYPE), tot_(tot)
	{
	type_decl_ = nullptr;
	type_decl_id_ = current_decl_id;
	declared_as_type_ = false;
	env_ = nullptr;
	value_var_ = default_value_var;
	ASSERT(value_var_);
	value_var_type_ = MEMBER_VAR;
	anonymous_value_var_ = false;
	size_var_field_ = nullptr;
	size_expr_ = nullptr;
	boundary_checked_ = false;
	parsing_complete_var_field_ = nullptr;
	parsing_state_var_field_ = nullptr;
	buffering_state_var_field_ = nullptr;
	has_value_field_ = nullptr;

	array_until_input_ = nullptr;

	incremental_input_ = false;
	buffer_input_ = false;
	incremental_parsing_ = false;

	fields_ = new FieldList();

	attrs_ = new AttrList();
	attr_byteorder_expr_ = nullptr;
	attr_checks_ = new ExprList();
	attr_enforces_ = new ExprList();
	attr_chunked_ = false;
	attr_exportsourcedata_ = false;
	attr_if_expr_ = nullptr;
	attr_length_expr_ = nullptr;
	attr_letfields_ = nullptr;
	attr_multiline_end_ = nullptr;
	attr_linebreaker_ = nullptr;
	attr_oneline_ = false;
	attr_refcount_ = false;
	attr_requires_ = new ExprList();
	attr_restofdata_ = false;
	attr_restofflow_ = false;
	attr_transient_ = false;
	}